

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O1

int __thiscall
Inter_Symbol_Generator::G_LT_Matrix_Generator
          (Inter_Symbol_Generator *this,Array_Data_Symbol *p,uint32_t M,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *_ESIs)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  uint8_t **ppuVar4;
  uint uVar5;
  uint uVar6;
  Inter_Symbol_Generator *this_00;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  Triple TVar11;
  
  if (this->G_LT != (uint8_t **)0x0) {
    operator_delete(this->G_LT,8);
  }
  iVar9 = M - p->L;
  this_00 = (Inter_Symbol_Generator *)&this->ESIs;
  uVar1 = p->K;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,_ESIs);
  ppuVar4 = new_matrix(this_00,iVar9 + uVar1,p->L);
  this->G_LT = ppuVar4;
  uVar7 = uVar1 + iVar9;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      TVar11 = Triple_Generator::triple_generator
                         (&this->triple,p->K,
                          (this->ESIs).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8],p->LP);
      uVar5 = TVar11.b;
      (this->triple)._triple = TVar11;
      if (p->L <= uVar5) {
        uVar1 = (this->triple)._triple.a;
        do {
          uVar5 = (uVar5 + uVar1) % p->LP;
          (this->triple)._triple.b = uVar5;
        } while (p->L <= uVar5);
      }
      this->G_LT[uVar8][uVar5] = '\x01';
      uVar3 = (this->triple)._triple.d - 1;
      uVar5 = p->L;
      if (uVar5 - 1 < uVar3) {
        uVar3 = uVar5 - 1;
      }
      if (uVar3 != 0) {
        uVar3 = 1;
        do {
          uVar6 = (this->triple)._triple.b;
          do {
            uVar2 = (ulong)(uVar6 + (this->triple)._triple.a) % (ulong)p->LP;
            uVar6 = (uint)uVar2;
          } while (uVar5 <= uVar6);
          (this->triple)._triple.b = uVar6;
          this->G_LT[uVar8][uVar2] = '\x01';
          uVar6 = (this->triple)._triple.d - 1;
          uVar5 = p->L;
          if (uVar5 - 1 < uVar6) {
            uVar6 = uVar5 - 1;
          }
          bVar10 = uVar3 < uVar6;
          uVar3 = uVar3 + 1;
        } while (bVar10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  return 0;
}

Assistant:

int Inter_Symbol_Generator::G_LT_Matrix_Generator(class Array_Data_Symbol *p, uint32_t M, std::vector<uint32_t> _ESIs)
{
	if (G_LT != NULL)
	{
		delete G_LT;
	}
	uint32_t overhead = M - p->L;
	uint32_t N = p->K + overhead;

	ESIs = _ESIs;

//	std::cout << "N: " << N << std::endl;


	G_LT = new_matrix(N, p->L);


	for (int i = 0; i < N; i++)
	{
		triple._triple = triple.triple_generator(p->K, ESIs[i], p->LP);
	//	std::cout << "d : " << triple._triple.d << " a: " << triple._triple.a << " b: " << triple._triple.b << std::endl;
		while(triple._triple.b >= p->L)
		{
			triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
		}

		G_LT[i][triple._triple.b] = 1;


		for (int j = 1; j <= std::min(triple._triple.d -1, p->L - 1); j++)
		{
			triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
			while(triple._triple.b >= p->L)
			{
				triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
			}
			//std::cout << "b: " << triple._triple.b << std::endl;
			G_LT[i][triple._triple.b] = 1;
		}
	}

//	matrix_print(G_LT, N, symbols_p->L);


	return 0;


}